

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

bool ON_GetPointListBoundingBox
               (int dim,bool is_rat,int count,int stride,double *points,ON_BoundingBox *tight_bbox,
               int bGrowBox,ON_Xform *xform)

{
  ON_3dPoint *pOVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  double dVar6;
  bool bVar7;
  double *pdVar8;
  int i;
  byte bVar9;
  int iVar10;
  bool bVar11;
  double dVar12;
  ON_Xform *pOVar13;
  ON_Xform *local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  ON_BoundingBox local_a8;
  ON_3dPoint local_78;
  double local_60;
  double local_58;
  ulong local_50;
  double local_48;
  long local_40;
  ON_BoundingBox *local_38;
  
  if (bGrowBox != 0) {
    bVar7 = ON_BoundingBox::IsNotEmpty(tight_bbox);
    bVar9 = 1;
    if (bVar7) goto LAB_0040a90c;
  }
  dVar4 = ON_BoundingBox::EmptyBoundingBox.m_max.z;
  dVar3 = ON_BoundingBox::EmptyBoundingBox.m_max.x;
  dVar2 = ON_BoundingBox::EmptyBoundingBox.m_min.z;
  dVar6 = ON_BoundingBox::EmptyBoundingBox.m_min.y;
  dVar12 = ON_BoundingBox::EmptyBoundingBox.m_min.x;
  (tight_bbox->m_max).y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
  (tight_bbox->m_max).z = dVar4;
  (tight_bbox->m_min).z = dVar2;
  (tight_bbox->m_max).x = dVar3;
  (tight_bbox->m_min).x = dVar12;
  (tight_bbox->m_min).y = dVar6;
  bVar9 = 0;
LAB_0040a90c:
  if ((points == (double *)0x0 || (dim < 1 || count < 1)) ||
     ((count != 1 && (stride < (int)((uint)is_rat + dim))))) {
    bVar7 = (bool)(bVar9 & count == 0);
  }
  else {
    local_38 = tight_bbox;
    ON_BoundingBox::ON_BoundingBox(&local_a8);
    ON_3dPoint::ON_3dPoint(&local_78,0.0,0.0,0.0);
    if (xform == (ON_Xform *)0x0) {
      local_c8 = (ON_Xform *)0x0;
    }
    else {
      bVar7 = ON_Xform::IsIdentity(xform,0.0);
      local_c8 = (ON_Xform *)0x0;
      if (!bVar7) {
        local_c8 = xform;
      }
    }
    i = 3;
    if ((uint)dim < 3) {
      i = dim;
    }
    local_40 = (long)stride;
    if (is_rat) {
      bVar7 = true;
      for (; 0 < count; count = count - 1) {
        dVar12 = points[(uint)dim];
        if ((dVar12 != 0.0) || (NAN(dVar12))) {
          local_50 = (ulong)(uint)(i * 8);
          memcpy(&local_a8,points,local_50);
          dVar12 = 1.0 / dVar12;
          local_a8.m_min.x = dVar12 * local_a8.m_min.x;
          local_a8.m_min.y = dVar12 * local_a8.m_min.y;
          local_a8.m_min.z = dVar12 * local_a8.m_min.z;
          goto LAB_0040aa6e;
        }
        points = points + local_40;
        bVar7 = false;
      }
      bVar7 = false;
    }
    else {
      local_50 = (ulong)(uint)(i * 8);
      memcpy(&local_a8,points,local_50);
      bVar7 = true;
LAB_0040aa6e:
      if (local_c8 != (ON_Xform *)0x0) {
        ON_3dPoint::Transform(&local_a8.m_min,local_c8);
      }
      lVar5 = local_40;
      local_a8.m_max.z = local_a8.m_min.z;
      local_a8.m_max.x = local_a8.m_min.x;
      local_a8.m_max.y = local_a8.m_min.y;
      if (1 < (uint)count) {
        pdVar8 = points + local_40;
        iVar10 = count - 1;
        if (is_rat) {
          if (local_c8 == (ON_Xform *)0x0) {
            local_b0 = local_a8.m_min.x;
            local_58 = local_a8.m_min.y;
            local_48 = local_a8.m_min.x;
            local_c8 = (ON_Xform *)local_a8.m_min.y;
            local_60 = local_a8.m_min.z;
            local_c0 = local_a8.m_min.z;
            while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
              dVar12 = pdVar8[(uint)dim];
              if ((dVar12 != 0.0) || (NAN(dVar12))) {
                memcpy(&local_78,pdVar8,local_50);
                dVar12 = 1.0 / dVar12;
                local_78.x = dVar12 * local_78.x;
                local_78.y = dVar12 * local_78.y;
                local_78.z = dVar12 * local_78.z;
                dVar12 = local_78.x;
                dVar6 = local_78.x;
                if ((local_b0 <= local_78.x) &&
                   (dVar12 = local_b0, dVar6 = local_a8.m_min.x, local_48 < local_78.x)) {
                  local_a8.m_max.x = local_78.x;
                  local_48 = local_78.x;
                }
                local_a8.m_min.x = dVar6;
                local_b0 = dVar12;
                if (local_58 <= local_78.y) {
                  pOVar1 = &local_a8.m_max;
                  pOVar13 = (ON_Xform *)local_78.y;
                  if ((double)local_c8 < local_78.y) goto LAB_0040ae3e;
                }
                else {
                  pOVar1 = &local_a8.m_min;
                  pOVar13 = local_c8;
                  local_58 = local_78.y;
LAB_0040ae3e:
                  pOVar1->y = local_78.y;
                  local_c8 = pOVar13;
                }
                if (local_60 <= local_78.z) {
                  pOVar1 = &local_a8.m_max;
                  dVar12 = local_78.z;
                  if (local_78.z <= local_c0) goto LAB_0040ae85;
                }
                else {
                  pOVar1 = &local_a8.m_min;
                  dVar12 = local_c0;
                  local_60 = local_78.z;
                }
                pOVar1->z = local_78.z;
                local_c0 = dVar12;
              }
              else {
                bVar7 = false;
              }
LAB_0040ae85:
              pdVar8 = pdVar8 + lVar5;
            }
          }
          else {
            while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
              dVar12 = pdVar8[(uint)dim];
              if ((dVar12 != 0.0) || (NAN(dVar12))) {
                memcpy(&local_78,pdVar8,local_50);
                dVar12 = 1.0 / dVar12;
                local_78.x = dVar12 * local_78.x;
                local_78.y = dVar12 * local_78.y;
                local_78.z = dVar12 * local_78.z;
                ON_3dPoint::Transform(&local_78,local_c8);
                if (local_a8.m_min.x <= local_78.x) {
                  if (local_a8.m_max.x < local_78.x) {
                    local_a8.m_max.x = local_78.x;
                  }
                }
                else {
                  local_a8.m_min.x = local_78.x;
                }
                pOVar1 = &local_a8.m_min;
                if ((local_78.y < local_a8.m_min.y) ||
                   (pOVar1 = &local_a8.m_max, local_a8.m_max.y < local_78.y)) {
                  pOVar1->y = local_78.y;
                }
                pOVar1 = &local_a8.m_min;
                if ((local_78.z < local_a8.m_min.z) ||
                   (pOVar1 = &local_a8.m_max, local_a8.m_max.z < local_78.z)) {
                  pOVar1->z = local_78.z;
                }
              }
              else {
                bVar7 = false;
              }
              pdVar8 = pdVar8 + lVar5;
            }
            if (dim < 3) {
              for (; i != 3; i = i + 1) {
                pdVar8 = ON_3dPoint::operator[](&local_a8.m_min,i);
                *pdVar8 = 0.0;
                pdVar8 = ON_3dPoint::operator[](&local_a8.m_max,i);
                *pdVar8 = 0.0;
              }
            }
          }
        }
        else if (local_c8 == (ON_Xform *)0x0) {
          local_c0 = local_a8.m_min.x;
          local_b0 = local_a8.m_min.y;
          local_60 = local_a8.m_min.x;
          local_b8 = local_a8.m_min.y;
          local_58 = local_a8.m_min.z;
          local_c8 = (ON_Xform *)local_a8.m_min.z;
          while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
            memcpy(&local_78,pdVar8,local_50);
            if (local_c0 <= local_78.x) {
              if (local_60 < local_78.x) {
                local_a8.m_max.x = local_78.x;
                local_60 = local_78.x;
              }
            }
            else {
              local_a8.m_min.x = local_78.x;
              local_c0 = local_78.x;
            }
            if (local_b0 <= local_78.y) {
              pOVar1 = &local_a8.m_max;
              dVar12 = local_78.y;
              if (local_b8 < local_78.y) goto LAB_0040af6d;
            }
            else {
              pOVar1 = &local_a8.m_min;
              local_b0 = local_78.y;
              dVar12 = local_b8;
LAB_0040af6d:
              pOVar1->y = local_78.y;
              local_b8 = dVar12;
            }
            if (local_58 <= local_78.z) {
              pOVar13 = (ON_Xform *)local_78.z;
              pOVar1 = &local_a8.m_max;
              if ((double)local_c8 < local_78.z) goto LAB_0040afa9;
            }
            else {
              local_58 = local_78.z;
              pOVar13 = local_c8;
              pOVar1 = &local_a8.m_min;
LAB_0040afa9:
              pOVar1->z = local_78.z;
              local_c8 = pOVar13;
            }
            pdVar8 = pdVar8 + lVar5;
          }
        }
        else {
          while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
            memcpy(&local_78,pdVar8,local_50);
            ON_3dPoint::Transform(&local_78,local_c8);
            if (local_a8.m_min.x <= local_78.x) {
              if (local_a8.m_max.x < local_78.x) {
                local_a8.m_max.x = local_78.x;
              }
            }
            else {
              local_a8.m_min.x = local_78.x;
            }
            pOVar1 = &local_a8.m_min;
            if ((local_78.y < local_a8.m_min.y) ||
               (pOVar1 = &local_a8.m_max, local_a8.m_max.y < local_78.y)) {
              pOVar1->y = local_78.y;
            }
            pOVar1 = &local_a8.m_min;
            if ((local_78.z < local_a8.m_min.z) ||
               (pOVar1 = &local_a8.m_max, local_a8.m_max.z < local_78.z)) {
              pOVar1->z = local_78.z;
            }
            pdVar8 = pdVar8 + lVar5;
          }
          if (dim < 3) {
            for (; i != 3; i = i + 1) {
              pdVar8 = ON_3dPoint::operator[](&local_a8.m_min,i);
              *pdVar8 = 0.0;
              pdVar8 = ON_3dPoint::operator[](&local_a8.m_max,i);
              *pdVar8 = 0.0;
            }
          }
        }
      }
      ON_BoundingBox::Union(local_38,&local_a8);
    }
  }
  return bVar7;
}

Assistant:

bool ON_GetPointListBoundingBox( 
    int dim, bool is_rat, int count, int stride, const double* points, 
    ON_BoundingBox& tight_bbox,
    int bGrowBox,
    const ON_Xform* xform
    )
{
  // bounding box workhorse
  bool rc = false;
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }
  if ( is_rat )
  {
    is_rat = 1;
  }

  if ( count > 0 && dim > 0 && points && (count == 1 || stride >= dim+is_rat) ) 
  {
    ON_BoundingBox bbox;
    ON_3dPoint P(0.0,0.0,0.0);
    double w;
    int i, wi;

    if ( xform && xform->IsIdentity() )
    {
      xform = 0;
    }
    wi = dim;
    if ( dim > 3 )
    {
      dim = 3;
    }

    rc = true;
    if ( is_rat ) 
    {
      // skip bogus starting points
      while ( count > 0 && points[wi] == 0.0 ) 
      {
        count--;
        points += stride;
        rc = false;
      }
      if ( count <= 0 )
        return false;
    }

    memcpy( &bbox.m_min.x, points, dim*sizeof(bbox.m_min.x) );
    if ( is_rat )
    {
      w = 1.0/points[wi];
      bbox.m_min.x *= w; bbox.m_min.y *= w; bbox.m_min.z *= w;
    }
    if ( xform )
    {
      bbox.m_min.Transform(*xform);
    }
    bbox.m_max = bbox.m_min;
    points += stride;
    count--;

    if ( count > 0 ) 
    {
      if ( is_rat )
      {
        // homogeneous rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &P.x, points, dim*sizeof(P.x) );
            w = 1.0/w;
            P.x *= w; P.y *= w; P.z *= w;
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &P.x, points, dim*sizeof(P.x) );
            w = 1.0/w;
            P.x *= w; P.y *= w; P.z *= w;
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
      else 
      {
        // bounding box of non-rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &P.x, points, dim*sizeof(P.x) );
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &P.x, points, dim*sizeof(P.x) );
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
    }

    tight_bbox.Union(bbox);
  }
  else if ( bGrowBox ) 
  {
    // result is still valid if no points are added to a valid input box
    rc = (0 == count);
  }

  return rc;
}